

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrule.cpp
# Opt level: O0

void __thiscall
icu_63::NFRule::doFormat
          (NFRule *this,double number,UnicodeString *toInsertInto,int32_t pos,int32_t recursionCount
          ,UErrorCode *status)

{
  NFSubstitution *pNVar1;
  int iVar2;
  UnicodeString *pUVar3;
  UnicodeString *pUVar4;
  int32_t iVar5;
  int32_t iVar6;
  uint64_t uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int local_1c4;
  int local_1a4;
  UnicodeString local_118;
  UnicodeString local_d8;
  UnicodeString *local_98;
  double pluralVal;
  UnicodeString local_80;
  int32_t local_40;
  int local_3c;
  int initialLength;
  int pluralRuleEnd;
  int32_t lengthOffset;
  int32_t pluralRuleStart;
  UErrorCode *status_local;
  int32_t recursionCount_local;
  int32_t pos_local;
  UnicodeString *toInsertInto_local;
  double number_local;
  NFRule *this_local;
  
  _lengthOffset = status;
  status_local._0_4_ = recursionCount;
  status_local._4_4_ = pos;
  _recursionCount_local = toInsertInto;
  toInsertInto_local = (UnicodeString *)number;
  number_local = (double)this;
  pluralRuleEnd = UnicodeString::length(&this->fRuleText);
  initialLength = 0;
  if (this->rulePatternFormat == (PluralFormat *)0x0) {
    UnicodeString::insert(_recursionCount_local,status_local._4_4_,&this->fRuleText);
  }
  else {
    pluralRuleEnd = UnicodeString::indexOf(&this->fRuleText,L"$(",-1,0);
    local_3c = UnicodeString::indexOf(&this->fRuleText,L")$",-1,pluralRuleEnd);
    local_40 = UnicodeString::length(_recursionCount_local);
    iVar2 = local_3c;
    iVar5 = UnicodeString::length(&this->fRuleText);
    pUVar3 = _recursionCount_local;
    iVar6 = status_local._4_4_;
    if (iVar2 < iVar5 + -1) {
      UnicodeString::tempSubString(&local_80,&this->fRuleText,local_3c + 2,0x7fffffff);
      UnicodeString::insert(pUVar3,iVar6,&local_80);
      UnicodeString::~UnicodeString(&local_80);
    }
    pUVar3 = toInsertInto_local;
    local_98 = toInsertInto_local;
    if (((double)toInsertInto_local < 0.0) || (1.0 <= (double)toInsertInto_local)) {
      uVar7 = util64_pow(this->radix,this->exponent);
      auVar9._8_4_ = (int)(uVar7 >> 0x20);
      auVar9._0_8_ = uVar7;
      auVar9._12_4_ = 0x45300000;
      local_98 = (UnicodeString *)
                 ((double)pUVar3 /
                 ((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)));
    }
    else {
      uVar7 = util64_pow(this->radix,this->exponent);
      auVar8._8_4_ = (int)(uVar7 >> 0x20);
      auVar8._0_8_ = uVar7;
      auVar8._12_4_ = 0x45300000;
      local_98 = (UnicodeString *)
                 uprv_round_63((double)pUVar3 *
                               ((auVar8._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)));
    }
    pUVar3 = _recursionCount_local;
    iVar6 = status_local._4_4_;
    PluralFormat::format(&local_d8,this->rulePatternFormat,(int)(double)local_98,_lengthOffset);
    UnicodeString::insert(pUVar3,iVar6,&local_d8);
    UnicodeString::~UnicodeString(&local_d8);
    pUVar3 = _recursionCount_local;
    iVar6 = status_local._4_4_;
    if (0 < pluralRuleEnd) {
      UnicodeString::tempSubString(&local_118,&this->fRuleText,0,pluralRuleEnd);
      UnicodeString::insert(pUVar3,iVar6,&local_118);
      UnicodeString::~UnicodeString(&local_118);
    }
    iVar6 = UnicodeString::length(&this->fRuleText);
    iVar5 = UnicodeString::length(_recursionCount_local);
    initialLength = iVar6 - (iVar5 - local_40);
  }
  pUVar4 = toInsertInto_local;
  pUVar3 = _recursionCount_local;
  iVar2 = status_local._4_4_;
  if (this->sub2 != (NFSubstitution *)0x0) {
    pNVar1 = this->sub2;
    iVar6 = NFSubstitution::getPos(this->sub2);
    if (pluralRuleEnd < iVar6) {
      local_1a4 = initialLength;
    }
    else {
      local_1a4 = 0;
    }
    (*(pNVar1->super_UObject)._vptr_UObject[7])
              (pUVar4,pNVar1,pUVar3,(ulong)(uint)(iVar2 - local_1a4),(ulong)(uint)status_local,
               _lengthOffset);
  }
  pUVar4 = toInsertInto_local;
  pUVar3 = _recursionCount_local;
  iVar2 = status_local._4_4_;
  if (this->sub1 != (NFSubstitution *)0x0) {
    pNVar1 = this->sub1;
    iVar6 = NFSubstitution::getPos(this->sub1);
    if (pluralRuleEnd < iVar6) {
      local_1c4 = initialLength;
    }
    else {
      local_1c4 = 0;
    }
    (*(pNVar1->super_UObject)._vptr_UObject[7])
              (pUVar4,pNVar1,pUVar3,(ulong)(uint)(iVar2 - local_1c4),(ulong)(uint)status_local,
               _lengthOffset);
  }
  return;
}

Assistant:

void
NFRule::doFormat(double number, UnicodeString& toInsertInto, int32_t pos, int32_t recursionCount, UErrorCode& status) const
{
    // first, insert the rule's rule text into toInsertInto at the
    // specified position, then insert the results of the substitutions
    // into the right places in toInsertInto
    // [again, we have two copies of this routine that do the same thing
    // so that we don't sacrifice precision in a long by casting it
    // to a double]
    int32_t pluralRuleStart = fRuleText.length();
    int32_t lengthOffset = 0;
    if (!rulePatternFormat) {
        toInsertInto.insert(pos, fRuleText);
    }
    else {
        pluralRuleStart = fRuleText.indexOf(gDollarOpenParenthesis, -1, 0);
        int pluralRuleEnd = fRuleText.indexOf(gClosedParenthesisDollar, -1, pluralRuleStart);
        int initialLength = toInsertInto.length();
        if (pluralRuleEnd < fRuleText.length() - 1) {
            toInsertInto.insert(pos, fRuleText.tempSubString(pluralRuleEnd + 2));
        }
        double pluralVal = number;
        if (0 <= pluralVal && pluralVal < 1) {
            // We're in a fractional rule, and we have to match the NumeratorSubstitution behavior.
            // 2.3 can become 0.2999999999999998 for the fraction due to rounding errors.
            pluralVal = uprv_round(pluralVal * util64_pow(radix, exponent));
        }
        else {
            pluralVal = pluralVal / util64_pow(radix, exponent);
        }
        toInsertInto.insert(pos, rulePatternFormat->format((int32_t)(pluralVal), status));
        if (pluralRuleStart > 0) {
            toInsertInto.insert(pos, fRuleText.tempSubString(0, pluralRuleStart));
        }
        lengthOffset = fRuleText.length() - (toInsertInto.length() - initialLength);
    }

    if (sub2 != NULL) {
        sub2->doSubstitution(number, toInsertInto, pos - (sub2->getPos() > pluralRuleStart ? lengthOffset : 0), recursionCount, status);
    }
    if (sub1 != NULL) {
        sub1->doSubstitution(number, toInsertInto, pos - (sub1->getPos() > pluralRuleStart ? lengthOffset : 0), recursionCount, status);
    }
}